

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

CURLcode ws_send_raw_blocking(CURL *data,websocket *ws,char *buffer,size_t buflen)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  int iVar3;
  size_t in_RAX;
  timediff_t timeout_ms;
  char *fmt;
  size_t nwritten;
  
  nwritten = in_RAX;
  while( true ) {
    do {
      if (buffer == (char *)0x0) {
        return CURLE_OK;
      }
      CVar2 = Curl_xfer_send(data,ws,(size_t)buffer,false,&nwritten);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      ws = (websocket *)((ws->dec).head + (nwritten - 0x20));
      buffer = buffer + -nwritten;
    } while (buffer == (char *)0x0);
    iVar3 = data->conn->sock[0];
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
        (0 < Curl_trc_feat_ws.log_level)))) {
      Curl_trc_ws(data,"ws_send_raw_blocking() partial, %zu left to send",buffer);
    }
    timeout_ms = Curl_timeleft(data,(curltime *)0x0,false);
    if (timeout_ms < 0) break;
    if (iVar3 == -1) {
      return CURLE_SEND_ERROR;
    }
    if (timeout_ms == 0) {
      timeout_ms = 500;
    }
    iVar3 = Curl_socket_check(-1,-1,iVar3,timeout_ms);
    if (iVar3 < 0) {
      fmt = "Error while waiting for socket becoming writable";
LAB_00161567:
      Curl_failf(data,fmt);
      return CURLE_SEND_ERROR;
    }
  }
  fmt = "Timeout waiting for socket becoming writable";
  goto LAB_00161567;
}

Assistant:

static CURLcode ws_send_raw_blocking(CURL *data, struct websocket *ws,
                                     const char *buffer, size_t buflen)
{
  CURLcode result = CURLE_OK;
  size_t nwritten;

  (void)ws;
  while(buflen) {
    result = Curl_xfer_send(data, buffer, buflen, FALSE, &nwritten);
    if(result)
      return result;
    DEBUGASSERT(nwritten <= buflen);
    buffer += nwritten;
    buflen -= nwritten;
    if(buflen) {
      curl_socket_t sock = data->conn->sock[FIRSTSOCKET];
      timediff_t left_ms;
      int ev;

      CURL_TRC_WS(data, "ws_send_raw_blocking() partial, %zu left to send",
                  buflen);
      left_ms = Curl_timeleft(data, NULL, FALSE);
      if(left_ms < 0) {
        failf(data, "Timeout waiting for socket becoming writable");
        return CURLE_SEND_ERROR;
      }

      /* POLLOUT socket */
      if(sock == CURL_SOCKET_BAD)
        return CURLE_SEND_ERROR;
      ev = Curl_socket_check(CURL_SOCKET_BAD, CURL_SOCKET_BAD, sock,
                             left_ms ? left_ms : 500);
      if(ev < 0) {
        failf(data, "Error while waiting for socket becoming writable");
        return CURLE_SEND_ERROR;
      }
    }
  }
  return result;
}